

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_wbmp.c
# Opt level: O1

void gdImageWBMPCtx(gdImagePtr image,int fg,gdIOCtx *out)

{
  int iVar1;
  int iVar2;
  Wbmp *wbmp;
  int y;
  long lVar3;
  
  wbmp = createwbmp(image->sx,image->sy,1);
  if (wbmp != (Wbmp *)0x0) {
    if (0 < image->sy) {
      iVar2 = 0;
      y = 0;
      do {
        if (0 < image->sx) {
          lVar3 = 0;
          do {
            iVar1 = gdImageGetPixel(image,(int)lVar3,y);
            if (iVar1 == fg) {
              wbmp->bitmap[iVar2 + lVar3] = 0;
            }
            lVar3 = lVar3 + 1;
          } while ((int)lVar3 < image->sx);
          iVar2 = iVar2 + (int)lVar3;
        }
        y = y + 1;
      } while (y < image->sy);
    }
    iVar2 = writewbmp(wbmp,gd_putout,out);
    if (iVar2 != 0) {
      gd_error("Could not save WBMP\n");
    }
    freewbmp(wbmp);
    return;
  }
  gd_error("Could not create WBMP\n");
  return;
}

Assistant:

BGD_DECLARE(void) gdImageWBMPCtx(gdImagePtr image, int fg, gdIOCtx *out)
{
	int x, y, pos;
	Wbmp *wbmp;

	/* create the WBMP */
	if((wbmp = createwbmp(gdImageSX(image), gdImageSY(image), WBMP_WHITE)) == NULL) {
		gd_error("Could not create WBMP\n");
		return;
	}

	/* fill up the WBMP structure */
	pos = 0;
	for(y = 0; y < gdImageSY(image); y++) {
		for(x = 0; x < gdImageSX(image); x++) {
			if(gdImageGetPixel(image, x, y) == fg) {
				wbmp->bitmap[pos] = WBMP_BLACK;
			}
			pos++;
		}
	}

	/* write the WBMP to a gd file descriptor */
	if(writewbmp(wbmp, &gd_putout, out)) {
		gd_error("Could not save WBMP\n");
	}

	/* des submitted this bugfix: gdFree the memory. */
	freewbmp(wbmp);
}